

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  object oVar1;
  object oVar2;
  tuple tVar3;
  object oVar4;
  bool bVar5;
  int iVar6;
  internals *this_00;
  type_info *ptVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  handle hVar11;
  undefined8 *puVar12;
  mapped_type *pmVar13;
  mapped_type *ppvVar14;
  mapped_type *ppvVar15;
  PyTypeObject *pPVar16;
  byte bVar17;
  string meta_name_;
  object ht_qualname;
  object scope_module;
  object name;
  allocator<char> local_109;
  object ht_qualname_meta;
  tuple bases;
  object metaclass;
  object scope_qualname;
  object meta_name;
  string full_name;
  object type_holder;
  type_index tindex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = get_internals();
  tindex._M_target = rec->type;
  ptVar7 = get_type_info(tindex._M_target,false);
  if (ptVar7 != (type_info *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&meta_name,rec->name,(allocator<char> *)&local_90);
    std::operator+(&meta_name_,"generic_type: type \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta_name);
    std::operator+(&full_name,&meta_name_,"\" is already registered!");
    pybind11_fail(&full_name);
  }
  name.super_handle.m_ptr = (handle)PyUnicode_FromString(rec->name);
  scope_module.super_handle.m_ptr = (handle)(PyObject *)0x0;
  hVar11.m_ptr = (rec->scope).m_ptr;
  if (hVar11.m_ptr == (PyObject *)0x0) {
LAB_001224ba:
    scope_qualname.super_handle.m_ptr = (handle)(PyObject *)0x0;
  }
  else {
    bVar5 = hasattr(hVar11,rec->name);
    if (bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&meta_name,rec->name,(allocator<char> *)&local_90);
      std::operator+(&meta_name_,"generic_type: cannot initialize type \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta_name
                    );
      std::operator+(&full_name,&meta_name_,"\": an object with that name is already defined");
      pybind11_fail(&full_name);
    }
    bVar5 = hasattr((rec->scope).m_ptr,"__module__");
    if (bVar5) {
      full_name._M_string_length = (size_type)(rec->scope).m_ptr;
      full_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_354c5;
      full_name.field_2._8_8_ = 0;
      accessor::operator_cast_to_object((accessor *)&meta_name_);
LAB_001223e0:
      object::operator=(&scope_module,(object *)&meta_name_);
      object::~object((object *)&meta_name_);
      object::~object((object *)((long)&full_name.field_2 + 8));
    }
    else {
      bVar5 = hasattr((rec->scope).m_ptr,"__name__");
      if (bVar5) {
        full_name._M_string_length = (size_type)(rec->scope).m_ptr;
        full_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_351df;
        full_name.field_2._8_8_ = 0;
        accessor::operator_cast_to_object((accessor *)&meta_name_);
        goto LAB_001223e0;
      }
    }
    hVar11.m_ptr = (rec->scope).m_ptr;
    scope_qualname.super_handle.m_ptr = (handle)(PyObject *)0x0;
    if (hVar11.m_ptr == (PyObject *)0x0) goto LAB_001224ba;
    bVar5 = hasattr(hVar11,"__qualname__");
    if (bVar5) {
      full_name._M_string_length = (size_type)(rec->scope).m_ptr;
      full_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_354d1;
      full_name.field_2._8_8_ = 0;
      accessor::operator_cast_to_object((accessor *)&meta_name_);
      object::operator=(&scope_qualname,(object *)&meta_name_);
      object::~object((object *)&meta_name_);
      object::~object((object *)((long)&full_name.field_2 + 8));
    }
    ht_qualname.super_handle.m_ptr = (handle)(PyObject *)0x0;
    ht_qualname_meta.super_handle.m_ptr = (handle)(PyObject *)0x0;
    if (scope_qualname.super_handle.m_ptr != (PyObject *)0x0) {
      full_name._M_dataplus._M_p =
           (pointer)PyUnicode_FromFormat
                              ("%U.%U",scope_qualname.super_handle.m_ptr,name.super_handle.m_ptr);
      object::operator=(&ht_qualname,(object *)&full_name);
      object::~object((object *)&full_name);
      goto LAB_001224d5;
    }
  }
  ht_qualname_meta.super_handle.m_ptr = (handle)(PyObject *)0x0;
  ht_qualname.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::operator=(&ht_qualname,&name);
LAB_001224d5:
  if ((rec->field_0x48 & 8) != 0) {
    full_name._M_dataplus._M_p =
         (pointer)PyUnicode_FromFormat("%U__Meta",ht_qualname.super_handle.m_ptr);
    object::operator=(&ht_qualname_meta,(object *)&full_name);
    object::~object((object *)&full_name);
  }
  if (scope_module.super_handle.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&full_name,rec->name,(allocator<char> *)&meta_name_);
  }
  else {
    str::str((str *)&local_90,&scope_module);
    str::operator_cast_to_string((string *)&meta_name,(str *)&local_90);
    std::operator+(&meta_name_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta_name,
                   ".");
    std::operator+(&full_name,&meta_name_,rec->name);
    std::__cxx11::string::~string((string *)&meta_name_);
    std::__cxx11::string::~string((string *)&meta_name);
    object::~object((object *)&local_90);
  }
  metaclass.super_handle.m_ptr = (handle)(PyObject *)0x0;
  if ((rec->field_0x48 & 8) != 0) {
    std::operator+(&meta_name_,&full_name,"__Meta");
    meta_name.super_handle.m_ptr = (handle)PyUnicode_FromString(meta_name_._M_dataplus._M_p);
    local_90._M_dataplus._M_p = (pointer)(*_pthread_once)(&PyType_Type,0);
    object::operator=(&metaclass,(object *)&local_90);
    object::~object((object *)&local_90);
    oVar4 = meta_name;
    oVar2 = metaclass;
    oVar1 = ht_qualname_meta;
    if ((metaclass.super_handle.m_ptr == (PyObject *)0x0) ||
       (name.super_handle.m_ptr == (PyObject *)0x0)) {
      pybind11_fail("generic_type::generic_type(): unable to create metaclass!");
    }
    meta_name.super_handle.m_ptr = (handle)(PyObject *)0x0;
    ((handle *)((long)metaclass.super_handle.m_ptr + 0x350))->m_ptr =
         (PyObject *)oVar4.super_handle.m_ptr;
    ht_qualname_meta.super_handle.m_ptr = (handle)(PyObject *)0x0;
    ((handle *)((long)metaclass.super_handle.m_ptr + 0x360))->m_ptr =
         (PyObject *)oVar1.super_handle.m_ptr;
    pcVar8 = strdup(meta_name_._M_dataplus._M_p);
    *(char **)((long)oVar2.super_handle.m_ptr + 0x18) = pcVar8;
    *(undefined **)((long)oVar2.super_handle.m_ptr + 0x100) = &PyType_Type;
    *(byte *)((long)oVar2.super_handle.m_ptr + 0xa9) =
         *(byte *)((long)oVar2.super_handle.m_ptr + 0xa9) | 2;
    iVar6 = PyType_Ready(oVar2.super_handle.m_ptr);
    if (iVar6 < 0) {
      pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
    }
    object::~object(&meta_name);
    std::__cxx11::string::~string((string *)&meta_name_);
  }
  sVar9 = list::size(&rec->bases);
  tuple::tuple(&bases,&(rec->bases).super_object);
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar10 = strlen(rec->doc);
    pcVar8 = (char *)PyObject_Malloc(sVar10 + 1);
    memcpy(pcVar8,rec->doc,sVar10 + 1);
  }
  hVar11.m_ptr = (PyObject *)(*_pthread_once)(&PyType_Type,0);
  type_holder.super_handle.m_ptr = (handle)(handle)hVar11.m_ptr;
  if (((PyTypeObject *)hVar11.m_ptr != (PyTypeObject *)0x0) &&
     (name.super_handle.m_ptr != (PyObject *)0x0)) {
    puVar12 = (undefined8 *)operator_new(0x68);
    puVar12[10] = 0;
    puVar12[0xb] = 0;
    puVar12[8] = 0;
    puVar12[9] = 0;
    puVar12[6] = 0;
    puVar12[7] = 0;
    puVar12[4] = 0;
    puVar12[5] = 0;
    puVar12[0xc] = 0;
    puVar12[2] = 0;
    puVar12[3] = 0;
    *(undefined2 *)(puVar12 + 0xc) = 0x101;
    *puVar12 = hVar11.m_ptr;
    puVar12[1] = rec->type_size;
    puVar12[2] = rec->init_holder;
    pmVar13 = std::__detail::
              _Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this_00->direct_conversions,&tindex);
    puVar12[9] = pmVar13;
    *(byte *)((long)puVar12 + 0x61) = (byte)rec->field_0x48 >> 4 & 1;
    ppvVar14 = std::__detail::
               _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&tindex);
    *ppvVar14 = puVar12;
    meta_name_._M_dataplus._M_p = (pointer)hVar11.m_ptr;
    ppvVar15 = std::__detail::
               _Map_base<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this_00->registered_types_py,(key_type *)&meta_name_);
    *ppvVar15 = puVar12;
    pPVar16 = (PyTypeObject *)strdup(full_name._M_dataplus._M_p);
    hVar11.m_ptr[1].ob_type = pPVar16;
    hVar11.m_ptr[2].ob_refcnt = rec->instance_size;
    if (sVar9 != 0) {
      meta_name_._M_string_length = (size_type)bases.super_object.super_handle.m_ptr;
      meta_name_.field_2._M_allocated_capacity = 0;
      meta_name_.field_2._8_8_ = 0;
      accessor::operator_cast_to_object((accessor *)&meta_name);
      if (meta_name.super_handle.m_ptr != (PyObject *)0x0) {
        *(long *)meta_name.super_handle.m_ptr = *(long *)meta_name.super_handle.m_ptr + 1;
      }
      hVar11.m_ptr[0x10].ob_refcnt = (Py_ssize_t)meta_name.super_handle.m_ptr;
      object::~object(&meta_name);
      object::~object((object *)((long)&meta_name_.field_2 + 8));
      tVar3 = bases;
      bases.super_object.super_handle.m_ptr = (object)(handle)0x0;
      hVar11.m_ptr[0x15].ob_refcnt = (Py_ssize_t)tVar3.super_object.super_handle.m_ptr;
      rec->field_0x48 = rec->field_0x48 | sVar9 != 1;
    }
    oVar4.super_handle.m_ptr = metaclass.super_handle.m_ptr;
    oVar2.super_handle.m_ptr = name.super_handle.m_ptr;
    oVar1.super_handle.m_ptr = ht_qualname.super_handle.m_ptr;
    name.super_handle.m_ptr = (handle)(PyObject *)0x0;
    hVar11.m_ptr[0x35].ob_refcnt = (Py_ssize_t)oVar2.super_handle.m_ptr;
    ht_qualname.super_handle.m_ptr = (handle)(PyObject *)0x0;
    hVar11.m_ptr[0x36].ob_refcnt = (Py_ssize_t)oVar1.super_handle.m_ptr;
    metaclass.super_handle.m_ptr = (handle)(PyObject *)0x0;
    (hVar11.m_ptr)->ob_type = (PyTypeObject *)oVar4.super_handle.m_ptr;
    hVar11.m_ptr[6].ob_refcnt = (Py_ssize_t)&hVar11.m_ptr[0x1b].ob_type;
    hVar11.m_ptr[6].ob_type = (PyTypeObject *)(hVar11.m_ptr + 0x2f);
    hVar11.m_ptr[7].ob_refcnt = (Py_ssize_t)&hVar11.m_ptr[0x2d].ob_type;
    hVar11.m_ptr[0x12].ob_type = (PyTypeObject *)init;
    hVar11.m_ptr[0x13].ob_type = (PyTypeObject *)new_instance;
    hVar11.m_ptr[3].ob_refcnt = (Py_ssize_t)rec->dealloc;
    hVar11.m_ptr[0xd].ob_refcnt = 0x18;
    pPVar16 = hVar11.m_ptr[10].ob_type;
    hVar11.m_ptr[10].ob_type = (PyTypeObject *)((ulong)pPVar16 & 0xffffffffffffb9ff | 0x600);
    bVar17 = rec->field_0x48;
    if ((bVar17 & 2) != 0) {
      hVar11.m_ptr[10].ob_type = (PyTypeObject *)((ulong)pPVar16 | 0x4600);
      hVar11.m_ptr[0x12].ob_refcnt = hVar11.m_ptr[2].ob_refcnt;
      hVar11.m_ptr[2].ob_refcnt = hVar11.m_ptr[2].ob_refcnt + 8;
      hVar11.m_ptr[0xf].ob_type = (PyTypeObject *)generic_getset;
      hVar11.m_ptr[0xb].ob_type = (PyTypeObject *)traverse;
      hVar11.m_ptr[0xc].ob_refcnt = (Py_ssize_t)clear;
      bVar17 = rec->field_0x48;
    }
    if ((bVar17 & 4) != 0) {
      hVar11.m_ptr[10].ob_refcnt = (Py_ssize_t)(hVar11.m_ptr + 0x34);
      hVar11.m_ptr[0x34].ob_refcnt = (Py_ssize_t)getbuffer;
      hVar11.m_ptr[0x34].ob_type = (PyTypeObject *)releasebuffer;
    }
    hVar11.m_ptr[0xb].ob_refcnt = (Py_ssize_t)pcVar8;
    (this->super_object).super_handle.m_ptr = (PyObject *)type_holder.super_handle.m_ptr;
    iVar6 = PyType_Ready(hVar11.m_ptr);
    if (iVar6 < 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,rec->name,&local_109);
      std::operator+(&local_90,&local_50,": PyType_Ready failed (");
      error_string_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta_name
                     ,&local_90,&local_70);
      std::operator+(&meta_name_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta_name
                     ,")!");
      pybind11_fail(&meta_name_);
    }
    if (scope_module.super_handle.m_ptr != (PyObject *)0x0) {
      meta_name_._M_string_length = (size_type)(this->super_object).super_handle.m_ptr;
      meta_name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_354c5;
      meta_name_.field_2._8_8_ = 0;
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)&meta_name_,
                 &scope_module);
      object::~object((object *)((long)&meta_name_.field_2 + 8));
    }
    if ((rec->scope).m_ptr != (PyObject *)0x0) {
      object_api<pybind11::handle>::attr
                ((obj_attr_accessor *)&meta_name_,(object_api<pybind11::handle> *)rec,
                 (PyObject *)hVar11.m_ptr[0x35].ob_refcnt);
      accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
                ((accessor<pybind11::detail::accessor_policies::obj_attr> *)&meta_name_,this);
      accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::obj_attr> *)&meta_name_);
    }
    if ((rec->field_0x48 & 1) != 0) {
      mark_parents_nonsimple(this,(PyTypeObject *)hVar11.m_ptr);
    }
    type_holder.super_handle.m_ptr = (handle)(PyObject *)0x0;
    object::~object(&type_holder);
    object::~object(&bases.super_object);
    object::~object(&metaclass);
    std::__cxx11::string::~string((string *)&full_name);
    object::~object(&ht_qualname_meta);
    object::~object(&ht_qualname);
    object::~object(&scope_qualname);
    object::~object(&scope_module);
    object::~object(&name);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&meta_name,rec->name,(allocator<char> *)&local_90);
  std::operator+(&meta_name_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meta_name,
                 ": Unable to create type object!");
  pybind11_fail(&meta_name_);
}

Assistant:

void initialize(type_record *rec) {
        auto &internals = get_internals();
        auto tindex = std::type_index(*(rec->type));

        if (get_type_info(*(rec->type)))
            pybind11_fail("generic_type: type \"" + std::string(rec->name) +
                          "\" is already registered!");

        auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec->name));
        object scope_module;
        if (rec->scope) {
            if (hasattr(rec->scope, rec->name))
                pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec->name) +
                        "\": an object with that name is already defined");

            if (hasattr(rec->scope, "__module__")) {
                scope_module = rec->scope.attr("__module__");
            } else if (hasattr(rec->scope, "__name__")) {
                scope_module = rec->scope.attr("__name__");
            }
        }

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        /* Qualified names for Python >= 3.3 */
        object scope_qualname;
        if (rec->scope && hasattr(rec->scope, "__qualname__"))
            scope_qualname = rec->scope.attr("__qualname__");
        object ht_qualname, ht_qualname_meta;
        if (scope_qualname)
            ht_qualname = reinterpret_steal<object>(PyUnicode_FromFormat(
                "%U.%U", scope_qualname.ptr(), name.ptr()));
        else
            ht_qualname = name;
        if (rec->metaclass)
            ht_qualname_meta = reinterpret_steal<object>(
                PyUnicode_FromFormat("%U__Meta", ht_qualname.ptr()));
#endif

#if !defined(PYPY_VERSION)
        std::string full_name = (scope_module ? ((std::string) pybind11::str(scope_module) + "." + rec->name)
                                              : std::string(rec->name));
#else
        std::string full_name = std::string(rec->name);
#endif

        /* Create a custom metaclass if requested (used for static properties) */
        object metaclass;
        if (rec->metaclass) {
            std::string meta_name_ = full_name + "__Meta";
            object meta_name = reinterpret_steal<object>(PYBIND11_FROM_STRING(meta_name_.c_str()));
            metaclass = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
            if (!metaclass || !name)
                pybind11_fail("generic_type::generic_type(): unable to create metaclass!");

            /* Danger zone: from now (and until PyType_Ready), make sure to
               issue no Python C API calls which could potentially invoke the
               garbage collector (the GC will call type_traverse(), which will in
               turn find the newly constructed type in an invalid state) */

            auto type = (PyHeapTypeObject*) metaclass.ptr();
            type->ht_name = meta_name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
            /* Qualified names for Python >= 3.3 */
            type->ht_qualname = ht_qualname_meta.release().ptr();
#endif
            type->ht_type.tp_name = strdup(meta_name_.c_str());
            type->ht_type.tp_base = &PyType_Type;
            type->ht_type.tp_flags |= (Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE) &
                                      ~Py_TPFLAGS_HAVE_GC;

            if (PyType_Ready(&type->ht_type) < 0)
                pybind11_fail("generic_type::generic_type(): failure in PyType_Ready() for metaclass!");
        }

        size_t num_bases = rec->bases.size();
        auto bases = tuple(rec->bases);

        char *tp_doc = nullptr;
        if (rec->doc && options::show_user_defined_docstrings()) {
            /* Allocate memory for docstring (using PyObject_MALLOC, since
               Python will free this later on) */
            size_t size = strlen(rec->doc) + 1;
            tp_doc = (char *) PyObject_MALLOC(size);
            memcpy((void *) tp_doc, rec->doc, size);
        }

        /* Danger zone: from now (and until PyType_Ready), make sure to
           issue no Python C API calls which could potentially invoke the
           garbage collector (the GC will call type_traverse(), which will in
           turn find the newly constructed type in an invalid state) */

        auto type_holder = reinterpret_steal<object>(PyType_Type.tp_alloc(&PyType_Type, 0));
        auto type = (PyHeapTypeObject*) type_holder.ptr();

        if (!type_holder || !name)
            pybind11_fail(std::string(rec->name) + ": Unable to create type object!");

        /* Register supplemental type information in C++ dict */
        detail::type_info *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) type;
        tinfo->type_size = rec->type_size;
        tinfo->init_holder = rec->init_holder;
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        tinfo->default_holder = rec->default_holder;
        internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[type] = tinfo;

        /* Basic type attributes */
        type->ht_type.tp_name = strdup(full_name.c_str());
        type->ht_type.tp_basicsize = (ssize_t) rec->instance_size;

        if (num_bases > 0) {
            type->ht_type.tp_base = (PyTypeObject *) ((object) bases[0]).inc_ref().ptr();
            type->ht_type.tp_bases = bases.release().ptr();
            rec->multiple_inheritance |= num_bases > 1;
        }

        type->ht_name = name.release().ptr();

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
        type->ht_qualname = ht_qualname.release().ptr();
#endif

        /* Metaclass */
        PYBIND11_OB_TYPE(type->ht_type) = (PyTypeObject *) metaclass.release().ptr();

        /* Supported protocols */
        type->ht_type.tp_as_number = &type->as_number;
        type->ht_type.tp_as_sequence = &type->as_sequence;
        type->ht_type.tp_as_mapping = &type->as_mapping;

        /* Supported elementary operations */
        type->ht_type.tp_init = (initproc) init;
        type->ht_type.tp_new = (newfunc) new_instance;
        type->ht_type.tp_dealloc = rec->dealloc;

        /* Support weak references (needed for the keep_alive feature) */
        type->ht_type.tp_weaklistoffset = offsetof(instance_essentials<void>, weakrefs);

        /* Flags */
        type->ht_type.tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
        type->ht_type.tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif
        type->ht_type.tp_flags &= ~Py_TPFLAGS_HAVE_GC;

        /* Support dynamic attributes */
        if (rec->dynamic_attr) {
            #if defined(PYPY_VERSION)
                pybind11_fail(std::string(rec->name) + ": dynamic attributes are "
                                                       "currently not supported in "
                                                       "conunction with PyPy!");
            #endif
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_GC;
            type->ht_type.tp_dictoffset = type->ht_type.tp_basicsize; // place the dict at the end
            type->ht_type.tp_basicsize += sizeof(PyObject *); // and allocate enough space for it
            type->ht_type.tp_getset = generic_getset;
            type->ht_type.tp_traverse = traverse;
            type->ht_type.tp_clear = clear;
        }

        if (rec->buffer_protocol) {
            type->ht_type.tp_as_buffer = &type->as_buffer;
#if PY_MAJOR_VERSION < 3
            type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_NEWBUFFER;
#endif
            type->as_buffer.bf_getbuffer = getbuffer;
            type->as_buffer.bf_releasebuffer = releasebuffer;
        }

        type->ht_type.tp_doc = tp_doc;

        m_ptr = type_holder.ptr();

        if (PyType_Ready(&type->ht_type) < 0)
            pybind11_fail(std::string(rec->name) + ": PyType_Ready failed (" +
                          detail::error_string() + ")!");

        if (scope_module) // Needed by pydoc
            attr("__module__") = scope_module;

        /* Register type with the parent scope */
        if (rec->scope)
            rec->scope.attr(handle(type->ht_name)) = *this;

        if (rec->multiple_inheritance)
            mark_parents_nonsimple(&type->ht_type);

        type_holder.release();
    }